

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffwrhdu(fitsfile *infptr,FILE *outstream,int *status)

{
  long lVar1;
  int *in_RDX;
  FILE *in_RSI;
  char buffer [2880];
  LONGLONG hduend;
  LONGLONG hdustart;
  long ii;
  long nb;
  int *in_stack_fffffffffffff478;
  LONGLONG *in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff488;
  int in_stack_fffffffffffff48c;
  LONGLONG *in_stack_fffffffffffff490;
  fitsfile *in_stack_fffffffffffff498;
  int *in_stack_fffffffffffff4c0;
  void *in_stack_fffffffffffff4c8;
  LONGLONG in_stack_fffffffffffff4d0;
  fitsfile *in_stack_fffffffffffff4d8;
  long local_40;
  long local_38;
  long local_30;
  int local_4;
  
  if (*in_RDX < 1) {
    ffghadll(in_stack_fffffffffffff498,in_stack_fffffffffffff490,
             (LONGLONG *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
             in_stack_fffffffffffff480,in_stack_fffffffffffff478);
    lVar1 = (local_40 - local_38) / 0xb40;
    if (0 < lVar1) {
      ffmbyt(in_stack_fffffffffffff498,(LONGLONG)in_stack_fffffffffffff490,in_stack_fffffffffffff48c
             ,(int *)in_stack_fffffffffffff480);
      for (local_30 = 0; local_30 < lVar1; local_30 = local_30 + 1) {
        ffgbyt(in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
               in_stack_fffffffffffff4c0);
        fwrite(&stack0xfffffffffffff478,1,0xb40,in_RSI);
      }
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffwrhdu(fitsfile *infptr,    /* I - FITS file pointer to input file  */
            FILE *outstream,     /* I - stream to write HDU to */
            int *status)         /* IO - error status     */
{
/*
  write the data unit from the CHDU of infptr to the output file stream
*/
    long nb, ii;
    LONGLONG hdustart, hduend;
    char buffer[2880];

    if (*status > 0)
        return(*status);

    ffghadll(infptr, &hdustart,  NULL, &hduend, status);

    nb = (long) ((hduend - hdustart) / 2880);  /* number of blocks to copy */

    if (nb > 0)
    {

        /* move to the start of the HDU */
        ffmbyt(infptr,  hdustart,  REPORT_EOF, status);

        for (ii = 0; ii < nb; ii++)
        {
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */
            fwrite(buffer, 1, 2880, outstream ); /* write to output stream */
        }
    }
    return(*status);
}